

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsPath.cpp
# Opt level: O3

string * __thiscall
WindowsPath::ToString_abi_cxx11_(string *__return_storage_ptr__,WindowsPath *this)

{
  int iVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  stringstream pathStream;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(this->mDriveLetter)._M_dataplus._M_p,
                        (this->mDriveLetter)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\\",2);
  }
  if ((this->mPathComponents).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    p_Var3 = (this->mPathComponents).
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,(char *)p_Var3[1]._M_next,(long)p_Var3[1]._M_prev);
    while (p_Var3 = p_Var3->_M_next, p_Var3 != (_List_node_base *)&this->mPathComponents) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\\",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,(char *)p_Var3[1]._M_next,(long)p_Var3[1]._M_prev);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string WindowsPath::ToString() const
{
	stringstream pathStream;
    
	if(mDriveLetter != "")
		pathStream<<mDriveLetter<<":\\";
    
	if(mPathComponents.size() > 0)
	{
		StringList::const_iterator it = mPathComponents.begin();
		pathStream<<*it;
		++it;
        
		for(; it != mPathComponents.end();++it)
			pathStream<<"\\"<<*it;
	}
    
	return pathStream.str();
}